

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int fixupReg(InternalInstruction *insn,OperandSpecifier *op)

{
  byte bVar1;
  uint uVar2;
  EABase EVar3;
  int iVar4;
  uint8_t uVar5;
  bool bVar6;
  uint8_t valid;
  bool local_19;
  
  bVar1 = op->encoding;
  iVar4 = -1;
  if (6 < bVar1 - 2) {
    if (bVar1 == 1) {
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->reg - (char)insn->regBase,&local_19);
      insn->reg = (uint)bVar1;
    }
    else {
      if (bVar1 != 9) {
        return -1;
      }
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->vvvv,&local_19);
      insn->vvvv = (uint)bVar1;
    }
    if (local_19 == false) {
      return -1;
    }
    goto LAB_001a71c5;
  }
  EVar3 = insn->eaBase;
  uVar2 = EVar3 - insn->eaRegBase;
  if (EVar3 < insn->eaRegBase) goto LAB_001a71c5;
  bVar1 = op->type;
  bVar6 = true;
  switch(bVar1 - 0x39) {
  case 0:
  case 3:
switchD_001a7051_caseD_0:
    uVar5 = '\x02';
    break;
  case 1:
  case 4:
  case 0x13:
switchD_001a7051_caseD_1:
    uVar5 = '\x04';
    break;
  case 2:
  case 5:
switchD_001a7051_caseD_2:
    uVar5 = '\b';
    break;
  case 6:
    uVar5 = '\x10';
    break;
  case 7:
    uVar5 = ' ';
    break;
  case 8:
    uVar5 = '@';
    break;
  case 9:
  case 0xc:
  case 0xd:
    goto switchD_001a7051_caseD_9;
  case 10:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
    goto switchD_001a7051_caseD_a;
  case 0x11:
    goto switchD_001a7051_caseD_11;
  case 0x12:
    goto switchD_001a7051_caseD_12;
  case 0x15:
    goto switchD_001a7051_caseD_15;
  default:
    switch(bVar1) {
    case 8:
      uVar5 = '\x01';
      goto LAB_001a7108;
    case 9:
      goto switchD_001a7051_caseD_0;
    case 10:
      goto switchD_001a7051_caseD_1;
    case 0xb:
      goto switchD_001a7051_caseD_2;
    }
    goto switchD_001a7051_caseD_a;
  }
LAB_001a7108:
  insn->operandSize = uVar5;
  switch(bVar1 - 0x39) {
  case 0:
  case 1:
  case 2:
    EVar3 = (uVar2 & 7) + EA_REG_MM0;
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    EVar3 = uVar2 + EA_REG_XMM0;
    break;
  case 7:
    EVar3 = uVar2 + EA_REG_YMM0;
    break;
  case 8:
    EVar3 = uVar2 + EA_REG_ZMM0;
    break;
  case 9:
  case 0xc:
  case 0xd:
switchD_001a7051_caseD_9:
    EVar3 = uVar2 + EA_REG_K0;
    break;
  case 10:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
switchD_001a7051_caseD_a:
    bVar6 = false;
    EVar3 = EA_BASE_NONE;
    break;
  case 0x11:
switchD_001a7051_caseD_11:
    EVar3 = (uVar2 & 7) + EA_REG_ES;
    break;
  case 0x12:
switchD_001a7051_caseD_12:
    bVar6 = (byte)uVar2 < 8;
    EVar3 = uVar2 + EA_REG_DR0;
    break;
  case 0x13:
    EVar3 = uVar2 + EA_REG_CR0;
    break;
  case 0x15:
    break;
  default:
    switch(bVar1) {
    case 8:
      if ((((byte)uVar2 & 0xfc) == 4) && (insn->rexPrefix != '\0')) {
        EVar3 = uVar2 + EA_REG_R12B;
      }
      else {
        EVar3 = uVar2 + EA_REG_AL;
      }
      break;
    case 9:
      EVar3 = uVar2 + EA_REG_AX;
      break;
    case 10:
      EVar3 = uVar2 + EA_REG_EAX;
      break;
    case 0xb:
      EVar3 = uVar2 + EA_REG_RAX;
      break;
    default:
      goto switchD_001a7051_caseD_a;
    }
  }
switchD_001a7051_caseD_15:
  insn->eaBase = EVar3 & EA_REG_CR12;
  if (bVar6) {
LAB_001a71c5:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int fixupReg(struct InternalInstruction *insn,
		const struct OperandSpecifier *op)
{
	uint8_t valid;

	// dbgprintf(insn, "fixupReg()");

	switch ((OperandEncoding)op->encoding) {
		default:
			//debug("Expected a REG or R/M encoding in fixupReg");
			return -1;
		case ENCODING_VVVV:
			insn->vvvv = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					insn->vvvv,
					&valid);
			if (!valid)
				return -1;
			break;
		case ENCODING_REG:
			insn->reg = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					(uint8_t)(insn->reg - insn->regBase),
					&valid);
			if (!valid)
				return -1;
			break;
		CASE_ENCODING_RM:
			if (insn->eaBase >= insn->eaRegBase) {
				insn->eaBase = (EABase)fixupRMValue(insn,
						(OperandType)op->type,
						(uint8_t)(insn->eaBase - insn->eaRegBase),
						&valid);
				if (!valid)
					return -1;
			}
			break;
	}

	return 0;
}